

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_optimize.cpp
# Opt level: O0

bool __thiscall
ON_LocalZero1::NewtonRaphson
          (ON_LocalZero1 *this,double s0,double f0,double s1,double f1,int maxit,double *t)

{
  bool bVar1;
  bool bVar2;
  double dVar3;
  uint uVar4;
  double dVar5;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_78;
  double prevds;
  double ds;
  double x;
  double d;
  double f;
  double s;
  double *t_local;
  double dStack_38;
  int maxit_local;
  double f1_local;
  double s1_local;
  double f0_local;
  double s0_local;
  ON_LocalZero1 *this_local;
  
  if ((this->m_f_tolerance < ABS(f0)) || (ABS(f1) < ABS(f0))) {
    if (this->m_f_tolerance < ABS(f1)) {
      dStack_38 = f1;
      f1_local = s1;
      s1_local = f0;
      f0_local = s0;
      if (0.0 < f0) {
        dStack_38 = f0;
        f1_local = s0;
        s1_local = f1;
        f0_local = s1;
      }
      f = (f0_local + f1_local) * 0.5;
      s = (double)t;
      t_local._4_4_ = maxit;
      s0_local = (double)this;
      uVar4 = (*this->_vptr_ON_LocalZero1[2])(f,this,&d,&x,0);
      if ((uVar4 & 1) == 0) {
        if (ABS(dStack_38) < ABS(s1_local)) {
          local_88 = f1_local;
        }
        else {
          local_88 = f0_local;
        }
        *(double *)s = local_88;
        this_local._7_1_ = false;
      }
      else if (this->m_f_tolerance < ABS(d)) {
        if (0.0 < dStack_38) {
          prevds = ABS(f1_local - f0_local);
          local_78 = 0.0;
          do {
            dVar3 = prevds;
            if (t_local._4_4_ == 0) {
              if (ABS(dStack_38) < ABS(s1_local)) {
                local_a8 = f1_local;
              }
              else {
                local_a8 = f0_local;
              }
              *(double *)s = local_a8;
              return false;
            }
            if ((0.0 < ((f0_local - f) * x + d) * ((f1_local - f) * x + d)) ||
               (ABS(local_78 * x) < ABS(d * 2.0))) {
              prevds = (f1_local - f0_local) * 0.5;
              f = f0_local + prevds;
              if ((f == f0_local) && (!NAN(f) && !NAN(f0_local))) {
                if (ABS(dStack_38) < ABS(s1_local)) {
                  f = f1_local;
                }
                *(double *)s = f;
                return true;
              }
            }
            else {
              prevds = -d / x;
              dVar5 = prevds + f;
              bVar1 = NAN(f);
              bVar2 = dVar5 == f;
              f = dVar5;
              if ((bVar2) && (!NAN(dVar5) && !bVar1)) {
                if (ABS(s1_local) < ABS(d)) {
                  d = s1_local;
                  f = f0_local;
                }
                if (ABS(dStack_38) < ABS(d)) {
                  f = f1_local;
                }
                *(double *)s = f;
                return true;
              }
            }
            local_78 = dVar3;
            t_local._4_4_ = t_local._4_4_ + -1;
            uVar4 = (*this->_vptr_ON_LocalZero1[2])(f,this,&d,&x,0);
            if ((uVar4 & 1) == 0) {
              if (ABS(dStack_38) < ABS(s1_local)) {
                local_98 = f1_local;
              }
              else {
                local_98 = f0_local;
              }
              *(double *)s = local_98;
              return false;
            }
            if (ABS(d) <= this->m_f_tolerance) {
              if (ABS(s1_local) < ABS(d)) {
                d = s1_local;
                *(double *)s = f0_local;
              }
              if (ABS(dStack_38) < ABS(d)) {
                *(double *)s = f1_local;
              }
              return true;
            }
            if (0.0 <= d) {
              dStack_38 = d;
              f1_local = f;
            }
            else {
              s1_local = d;
              f0_local = f;
            }
          } while (this->m_t_tolerance < ABS(f1_local - f0_local));
          if (ABS(dStack_38) < ABS(s1_local)) {
            local_a0 = f1_local;
          }
          else {
            local_a0 = f0_local;
          }
          *(double *)s = local_a0;
          this_local._7_1_ = true;
        }
        else {
          if (ABS(dStack_38) < ABS(s1_local)) {
            local_90 = f1_local;
          }
          else {
            local_90 = f0_local;
          }
          *(double *)s = local_90;
          this_local._7_1_ = false;
        }
      }
      else {
        *(double *)s = f;
        this_local._7_1_ = true;
      }
    }
    else {
      *t = s1;
      this_local._7_1_ = true;
    }
  }
  else {
    *t = s0;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_LocalZero1::NewtonRaphson( double s0, double f0,
                                    double s1, double f1,
                                    int maxit, double* t )
{
  // private function - input must satisfy
  //
  // 1) t is not nullptr
  //
  // 2) maxit >= 2
  //
  // 3) s0 != s1, 
  //
  // 4) f0 = f(s0), f1 = f(s1), 
  //
  // 5) either f0 < 0.0 and f1 > 0.0, or f0 > 0.0 and f1 < 0.0
  //
  // 6) f() is C0 on [s0,s1] and C2 on (s0,s1)
  //
  // 7) ds_tolerance >= 0.0 - the search for a zero will stop
  //    if the zero in bracketed in an interval that is no
  //    larger than ds_tolerance.
  //
  //    When in doubt, ds_tolerance = (fabs(s0) + fabs(s1))*ON_EPSILON
  //    works well.

  double s, f, d, x, ds, prevds;

  if ( fabs(f0) <= m_f_tolerance && fabs(f0) <= fabs(f1) ) {
    // |f(s0)| <= user specified stopping tolerance
    *t = s0;
    return true;
  }
  if ( fabs(f1) <= m_f_tolerance ) {
    // |f(s1)| <= user specified stopping tolerance
    *t = s1;
    return true;
  }

  if ( f0 > 0.0 ) {
    x = s0; s0 = s1; s1 = x;
    x = f0; f0 = f1; f1 = x;
  }

  s = 0.5*(s0+s1);
  if ( !Evaluate( s, &f, &d, 0 ) ) {
    *t = (fabs(f0) <= fabs(f1)) ? s0 : s1;
    return false;
  }

  if ( fabs(f) <= m_f_tolerance ) {
    // |f(s)| <= user specified stopping tolerance
    *t = s;
    return true;
  }

  if ( f1 <= 0.0 ) {
    *t = (fabs(f0) <= fabs(f1)) ? s0 : s1;
    return false;
  }

  ds = fabs(s1-s0);
  prevds = 0.0;

  while (maxit--) {
    if ( (f+(s0-s)*d)*(f+(s1-s)*d) > 0.0  // true if NR's line segment doesn't cross zero inside interval
         || fabs(2.0*f) > fabs(prevds*d)  // true if expected decrease in function value from previous step didn't happen
         ) {
      // bisect
      prevds = ds;
      ds = 0.5*(s1-s0);
      s = s0+ds;
      if ( s == s0 ) {
        // interval is too small to be divided using double division
        if ( fabs(f1) < fabs(f0) ) {
          s = s1;
        }
        *t = s;
        return true;
      }      
    }
    else {
      // Newton iterate
      prevds = ds;
      ds = -f/d;
      x = s;
      s += ds;
      if ( s == x ) {
        // Newton step size < smallest double than can be added to s
        if ( fabs(f0) < fabs(f) ) {
          f = f0;
          s = s0;
        }
        if ( fabs(f1) < fabs(f) ) {
          s = s1;
        }
        *t = s;
        return true;
      } 
    }

    if ( !Evaluate( s, &f, &d, 0 ) ) {
      *t = (fabs(f0) <= fabs(f1)) ? s0 : s1; // emergency bailout
      return false;
    }

    if ( fabs(f) <= m_f_tolerance ) {
      // |f(s)| <= user specified stopping tolerance
      if ( fabs(f0) < fabs(f) ) {
        f = f0;
        *t = s0;
      }
      if ( fabs(f1) < fabs(f) ) {
        *t = s1;
      }
      return true;
    }

    if ( f < 0.0 ) {
      f0 = f; // f0 needed for emergency bailout
      s0 = s;
    }
    else { // f > 0.0
      f1 = f; // f1 needed for emergency bailout
      s1 = s;
    }

    if ( fabs(s1-s0) <= m_t_tolerance ) {
      // a root has been bracketed to an interval that is small enough
      // to satisfy user.
      *t = (fabs(f0) <= fabs(f1)) ? s0 : s1;
      return true;
    }
  }

  *t = (fabs(f0) <= fabs(f1)) ? s0 : s1; // emergency bailout
  return false;
}